

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_helper.cpp
# Opt level: O3

pair<double,_double>
Performance_Test::runPerformanceTest(performanceFunction function,uint32_t size)

{
  TimerContainer *pTVar1;
  TimerContainer *pTVar2;
  pair<double,_double> pVar3;
  TimerContainer timer;
  TimerContainer local_40;
  
  local_40.super_BaseTimerContainer._time.super__List_base<double,_std::allocator<double>_>._M_impl.
  _M_node._M_size = 0;
  local_40.super_BaseTimerContainer._time.super__List_base<double,_std::allocator<double>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&local_40;
  local_40.super_BaseTimerContainer._time.super__List_base<double,_std::allocator<double>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&local_40;
  local_40._startTime.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  (*function)(&local_40,size);
  pVar3 = BaseTimerContainer::mean(&local_40.super_BaseTimerContainer);
  pTVar2 = (TimerContainer *)
           local_40.super_BaseTimerContainer._time.super__List_base<double,_std::allocator<double>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (pTVar2 != &local_40) {
    pTVar1 = (TimerContainer *)
             (pTVar2->super_BaseTimerContainer)._time.
             super__List_base<double,_std::allocator<double>_>._M_impl._M_node.super__List_node_base
             ._M_next;
    operator_delete(pTVar2);
    pTVar2 = pTVar1;
  }
  return pVar3;
}

Assistant:

std::pair < double, double > runPerformanceTest(performanceFunction function, uint32_t size )
    {
        Performance_Test::TimerContainer timer;
        function( timer, size  );
        return timer.mean();
    }